

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O3

void Fraig_CollectXors(Fraig_Node_t *pNode1,Fraig_Node_t *pNode2,int iWordLast,int fUseRand,
                      uint *puMask)

{
  uint *puVar1;
  uint *puVar2;
  ulong uVar3;
  
  if (((ulong)pNode1 & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pNode1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fraig/fraigTable.c"
                  ,0x1e2,
                  "void Fraig_CollectXors(Fraig_Node_t *, Fraig_Node_t *, int, int, unsigned int *)"
                 );
  }
  if (((ulong)pNode2 & 1) == 0) {
    if (0 < iWordLast) {
      puVar1 = (&pNode1->puSimR)[fUseRand == 0];
      puVar2 = (&pNode2->puSimR)[fUseRand == 0];
      uVar3 = 0;
      do {
        puMask[uVar3] = puVar2[uVar3] ^ puVar1[uVar3];
        uVar3 = uVar3 + 1;
      } while ((uint)iWordLast != uVar3);
    }
    return;
  }
  __assert_fail("!Fraig_IsComplement(pNode2)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fraig/fraigTable.c"
                ,0x1e3,
                "void Fraig_CollectXors(Fraig_Node_t *, Fraig_Node_t *, int, int, unsigned int *)");
}

Assistant:

void Fraig_CollectXors( Fraig_Node_t * pNode1, Fraig_Node_t * pNode2, int iWordLast, int fUseRand, unsigned * puMask )
{
    unsigned * pSims1, * pSims2;
    int i;
    assert( !Fraig_IsComplement(pNode1) );
    assert( !Fraig_IsComplement(pNode2) );
    // get hold of simulation info
    pSims1 = fUseRand? pNode1->puSimR : pNode1->puSimD;
    pSims2 = fUseRand? pNode2->puSimR : pNode2->puSimD;    
    // check the simulation info
    for ( i = 0; i < iWordLast; i++ )
        puMask[i] = ( pSims1[i] ^ pSims2[i] );
}